

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testpixmap.cpp
# Opt level: O0

int main(void)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  Am_Value *pAVar6;
  Am_Method_Wrapper *pAVar7;
  Am_Constraint *pAVar8;
  Am_Object *pAVar9;
  ostream *poVar10;
  void *this;
  Am_Object local_1b8;
  Am_Object local_1b0;
  Am_Object local_1a8;
  Am_Object local_1a0;
  Am_Object local_198;
  Am_Object local_190;
  Am_Object local_188;
  Am_Object local_180;
  Am_Object local_178;
  Am_Object local_170;
  Am_Object local_168;
  Am_Object local_160;
  Am_Object local_158;
  Am_Object local_150;
  Am_Object local_148;
  Am_Object image_setting;
  Am_Object local_138;
  Am_Object local_130;
  Am_Object local_128;
  Am_Object local_120;
  Am_Object mode_setting;
  Am_Object local_110;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object line_setting;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object fill_setting;
  int line_position;
  int text_spacing;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object settings;
  Am_Object local_a0;
  Am_Object settings_group;
  Am_Object local_90;
  Am_Object cmd;
  Am_Object local_80;
  Am_Object how_set_inter;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object bitmap2;
  Am_Object local_50;
  Am_Object local_48;
  Am_Image_Array local_40 [8];
  Am_Image_Array image;
  char *pathname;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object window;
  
  window.data._4_4_ = 0;
  Am_Initialize();
  Am_Object::Create((char *)&local_20);
  uVar1 = Am_Object::Set((ushort)&local_20,(char *)0x6c,0x10614f);
  uVar1 = Am_Object::Set(uVar1,0x66,600);
  uVar1 = Am_Object::Set(uVar1,0x67,300);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::Am_Object(&local_18,pAVar5);
  Am_Object::~Am_Object(&local_20);
  _image = (char *)Am_Merge_Pathname("images/bugsmall.gif");
  Am_Image_Array::Am_Image_Array(local_40,_image);
  if (_image != (char *)0x0) {
    operator_delete__(_image);
  }
  Am_Object::Create((char *)&local_48);
  uVar1 = Am_Object::Set((ushort)&local_48,100,10);
  uVar1 = Am_Object::Set(uVar1,0x65,10);
  pAVar4 = Am_Image_Array::operator_cast_to_Am_Wrapper_(local_40);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xb0,(ulong)pAVar4);
  Am_Object::operator=(&bitmap,pAVar5);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Am_Object(&local_50,(Am_Object *)&bitmap);
  Am_Object::Add_Part((Am_Object *)&local_18,SUB81(&local_50,0),1);
  Am_Object::~Am_Object(&local_50);
  _image = (char *)Am_Merge_Pathname("images/eye10.gif");
  Am_Image_Array::Am_Image_Array((Am_Image_Array *)&bitmap2,_image);
  Am_Image_Array::operator=(local_40,(Am_Image_Array *)&bitmap2);
  Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&bitmap2);
  if (_image != (char *)0x0) {
    operator_delete__(_image);
  }
  Am_Object::Create((char *)&local_68);
  pAVar4 = Am_Image_Array::operator_cast_to_Am_Wrapper_(local_40);
  pAVar5 = (Am_Object *)Am_Object::Set((ushort)&local_68,(Am_Wrapper *)0xb0,(ulong)pAVar4);
  Am_Object::Am_Object(&local_60,pAVar5);
  Am_Object::~Am_Object(&local_68);
  Am_Object::Am_Object(&local_70,(Am_Object *)&local_60);
  Am_Object::Add_Part((Am_Object *)&local_18,SUB81(&local_70,0),1);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Am_Object(&how_set_inter,(Am_Object *)&local_60);
  Am_To_Bottom((Am_Object *)&how_set_inter);
  Am_Object::~Am_Object(&how_set_inter);
  Am_Object::Create((char *)&cmd);
  uVar1 = Am_Object::Set((ushort)&cmd,(char *)0xb9,0x1061a6);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,true,1);
  Am_Object::Am_Object(&local_80,pAVar5);
  Am_Object::~Am_Object(&cmd);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_80,0xc5);
  Am_Object::Am_Object(&local_90,pAVar6);
  pAVar7 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&change_setting);
  Am_Object::Set((ushort)&local_90,(Am_Method_Wrapper *)0xca,(ulong)pAVar7);
  Am_Object::Am_Object(&settings_group,(Am_Object *)&local_80);
  Am_Object::Add_Part((Am_Object *)&local_18,SUB81(&settings_group,0),1);
  Am_Object::~Am_Object(&settings_group);
  Am_Object::Create((char *)&settings);
  uVar1 = Am_Object::Set((ushort)&settings,0x65,100);
  uVar1 = Am_Object::Set(uVar1,100,10);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x66,(ulong)pAVar8);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar8);
  Am_Object::Am_Object(&local_a0,pAVar5);
  Am_Object::~Am_Object(&settings);
  Am_Object::Create((char *)&local_b8);
  pAVar5 = (Am_Object *)Am_Object::Set((ushort)&local_b8,(char *)0xab,0x1061c2);
  Am_Object::Am_Object(&local_b0,pAVar5);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::Am_Object((Am_Object *)&line_position,(Am_Object *)&local_b0);
  Am_Object::Add_Part((Am_Object *)&local_a0,SUB81(&line_position,0),1);
  Am_Object::~Am_Object((Am_Object *)&line_position);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_b0,0x67);
  iVar2 = Am_Value::operator_cast_to_int(pAVar6);
  fill_setting.data._4_4_ = iVar2 + 2U;
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&local_b0,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  fill_setting.data._0_4_ = iVar2 + 2U + iVar3;
  Am_Object::Create((char *)&local_d8);
  uVar1 = Am_Object::Set((ushort)&local_d8,0x65,(ulong)fill_setting.data._4_4_);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x1061df);
  Am_Object::Am_Object(&local_d0,pAVar5);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::Am_Object(&local_e0,(Am_Object *)&local_d0);
  pAVar5 = (Am_Object *)Am_Object::Add_Part((Am_Object *)&local_a0,SUB81(&local_e0,0),1);
  Am_Object::Create((char *)&line_setting);
  uVar1 = Am_Object::Set((ushort)&line_setting,0x65,(ulong)(uint)fill_setting.data);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar1,0x66,0x87);
  Am_Object::Am_Object(&local_e8,pAVar9);
  Am_Object::Add_Part(pAVar5,SUB81(&local_e8,0),1);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::~Am_Object(&line_setting);
  Am_Object::~Am_Object(&local_e0);
  Am_Object::Create((char *)&local_100);
  uVar1 = Am_Object::Set((ushort)&local_100,0x65,(ulong)fill_setting.data._4_4_);
  uVar1 = Am_Object::Set(uVar1,100,0x91);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x1061fd);
  Am_Object::Am_Object(&local_f8,pAVar5);
  Am_Object::~Am_Object(&local_100);
  Am_Object::Am_Object(&local_108,(Am_Object *)&local_f8);
  pAVar5 = (Am_Object *)Am_Object::Add_Part((Am_Object *)&local_a0,SUB81(&local_108,0),1);
  Am_Object::Create((char *)&mode_setting);
  uVar1 = Am_Object::Set((ushort)&mode_setting,0x65,(ulong)(uint)fill_setting.data);
  uVar1 = Am_Object::Set(uVar1,100,0x91);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar1,0x66,0x87);
  Am_Object::Am_Object(&local_110,pAVar9);
  Am_Object::Add_Part(pAVar5,SUB81(&local_110,0),1);
  Am_Object::~Am_Object(&local_110);
  Am_Object::~Am_Object(&mode_setting);
  Am_Object::~Am_Object(&local_108);
  Am_Object::Create((char *)&local_128);
  uVar1 = Am_Object::Set((ushort)&local_128,0x65,(ulong)fill_setting.data._4_4_);
  uVar1 = Am_Object::Set(uVar1,100,0x122);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x106215);
  Am_Object::Am_Object(&local_120,pAVar5);
  Am_Object::~Am_Object(&local_128);
  Am_Object::Am_Object(&local_130,(Am_Object *)&local_120);
  pAVar5 = (Am_Object *)Am_Object::Add_Part((Am_Object *)&local_a0,SUB81(&local_130,0),1);
  Am_Object::Create((char *)&image_setting);
  uVar1 = Am_Object::Set((ushort)&image_setting,0x65,(ulong)(uint)fill_setting.data);
  uVar1 = Am_Object::Set(uVar1,100,0x122);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar1,0x66,0x87);
  Am_Object::Am_Object(&local_138,pAVar9);
  Am_Object::Add_Part(pAVar5,SUB81(&local_138,0),1);
  Am_Object::~Am_Object(&local_138);
  Am_Object::~Am_Object(&image_setting);
  Am_Object::~Am_Object(&local_130);
  Am_Object::Create((char *)&local_150);
  uVar1 = Am_Object::Set((ushort)&local_150,0x65,(ulong)fill_setting.data._4_4_);
  uVar1 = Am_Object::Set(uVar1,100,0x1b3);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x106230);
  Am_Object::Am_Object(&local_148,pAVar5);
  Am_Object::~Am_Object(&local_150);
  Am_Object::Am_Object(&local_158,(Am_Object *)&local_148);
  pAVar5 = (Am_Object *)Am_Object::Add_Part((Am_Object *)&local_a0,SUB81(&local_158,0),1);
  Am_Object::Create((char *)&local_168);
  uVar1 = Am_Object::Set((ushort)&local_168,0x65,(ulong)(uint)fill_setting.data);
  uVar1 = Am_Object::Set(uVar1,100,0x1b3);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar1,0x66,0x87);
  Am_Object::Am_Object(&local_160,pAVar9);
  Am_Object::Add_Part(pAVar5,SUB81(&local_160,0),1);
  Am_Object::~Am_Object(&local_160);
  Am_Object::~Am_Object(&local_168);
  Am_Object::~Am_Object(&local_158);
  fill_setting.data._4_4_ = fill_setting.data._4_4_ * 2 + 3;
  Am_Object::Create((char *)&local_170);
  uVar1 = Am_Object::Set((ushort)&local_170,0x65,(ulong)fill_setting.data._4_4_);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x106246);
  Am_Object::operator=(&fill_style,pAVar5);
  Am_Object::~Am_Object(&local_170);
  Am_Object::Am_Object(&local_178,(Am_Object *)&fill_style);
  Am_Object::Add_Part((Am_Object *)&local_a0,SUB81(&local_178,0),1);
  Am_Object::~Am_Object(&local_178);
  Am_Object::Create((char *)&local_180);
  uVar1 = Am_Object::Set((ushort)&local_180,0x65,(ulong)fill_setting.data._4_4_);
  uVar1 = Am_Object::Set(uVar1,100,0x91);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x106267);
  Am_Object::operator=(&line_style,pAVar5);
  Am_Object::~Am_Object(&local_180);
  Am_Object::Am_Object(&local_188,(Am_Object *)&line_style);
  Am_Object::Add_Part((Am_Object *)&local_a0,SUB81(&local_188,0),1);
  Am_Object::~Am_Object(&local_188);
  Am_Object::Create((char *)&local_190);
  uVar1 = Am_Object::Set((ushort)&local_190,0x65,(ulong)fill_setting.data._4_4_);
  uVar1 = Am_Object::Set(uVar1,100,0x122);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x10627f);
  Am_Object::operator=(&mode,pAVar5);
  Am_Object::~Am_Object(&local_190);
  Am_Object::Am_Object(&local_198,(Am_Object *)&mode);
  Am_Object::Add_Part((Am_Object *)&local_a0,SUB81(&local_198,0),1);
  Am_Object::~Am_Object(&local_198);
  Am_Object::Create((char *)&local_1a0);
  uVar1 = Am_Object::Set((ushort)&local_1a0,0x65,(ulong)fill_setting.data._4_4_);
  uVar1 = Am_Object::Set(uVar1,100,0x1b3);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xab,0x106169);
  Am_Object::operator=(&image_name,pAVar5);
  Am_Object::~Am_Object(&local_1a0);
  Am_Object::Am_Object(&local_1a8,(Am_Object *)&image_name);
  Am_Object::Add_Part((Am_Object *)&local_a0,SUB81(&local_1a8,0),1);
  Am_Object::~Am_Object(&local_1a8);
  Am_Object::Am_Object(&local_1b0,(Am_Object *)&local_a0);
  Am_Object::Add_Part((Am_Object *)&local_18,SUB81(&local_1b0,0),1);
  Am_Object::~Am_Object(&local_1b0);
  Am_Object::Am_Object(&local_1b8,(Am_Object *)&local_18);
  Am_Object::Add_Part((Am_Object *)&Am_Screen,SUB81(&local_1b8,0),1);
  Am_Object::~Am_Object(&local_1b8);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'1\' to display ent.xbm");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'2\' to display ent.gif (transparent)");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'3\' to display opaque_ent.gif");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'4\' to display eye10.gif (transparent)");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'5\' to display opaque_eye10.gif");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,
                            "Type \'6\' to display spaceship.gif (transparent)");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'7\' to display opaque_spaceship.gif");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'b\' to set fill style to Am_Black");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'g\' to set fill style to Am_Green");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'n\' to set fill style to Am_No_Style");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'r\' to set fill style to Am_Red");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'w\' to set fill style to Am_White");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'B\' to set line style to Am_Black");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'G\' to set line style to Am_Green");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'N\' to set line style to Am_No_Style");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'R\' to set line style to Am_Red");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'W\' to set line style to Am_White");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'m\' to set draw monochrome to true");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'c\' to set draw monochrome to false");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'f\' to read a nonexistent file");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,
                            "Type \'t\' to print the current image in RBG form first row first");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,
                            "Type \'T\' to print bugsmall.gif in RBG form first row last");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,
                            "Type \'z\' to print and display spiral bitmap in RBG form first row first"
                           );
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,
                            "Type \'Z\' to print spiral bitmap in RBG form first row last");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  poVar10 = std::operator<<((ostream *)&std::cout,"Type \'q\' to quit ");
  this = (void *)std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  Am_Main_Event_Loop();
  Am_Cleanup();
  window.data._4_4_ = 0;
  Am_Object::~Am_Object(&local_148);
  Am_Object::~Am_Object(&local_120);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_d0);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_60);
  Am_Image_Array::~Am_Image_Array(local_40);
  Am_Object::~Am_Object(&local_18);
  return window.data._4_4_;
}

Assistant:

int
main(void)
{
  Am_Initialize();

  Am_Object window =
      Am_Window.Create()
          .Set(Am_TITLE, "Amulet Pixmap Test")
          .Set(Am_WIDTH, 600)
          .Set(Am_HEIGHT, 300)
          .Set(Am_FILL_STYLE,
               Am_Amulet_Purple) // tests putting on top of color backgrounds
      ;

  const char *pathname = Am_Merge_Pathname("images/bugsmall.gif");
  Am_Image_Array image = Am_Image_Array(pathname);
  delete[] pathname;
  bitmap = Am_Bitmap.Create("bitmap")
               .Set(Am_LEFT, 10)
               .Set(Am_TOP, 10)
               .Set(Am_IMAGE, image);
  window.Add_Part(bitmap);

  pathname = Am_Merge_Pathname("images/eye10.gif");
  image = Am_Image_Array(pathname);
  delete[] pathname;
  Am_Object bitmap2 = Am_Bitmap.Create("bitmap2").Set(Am_IMAGE, image);
  window.Add_Part(bitmap2);
  Am_To_Bottom(bitmap2);

  Am_Object how_set_inter = Am_One_Shot_Interactor.Create("change_settings")
                                .Set(Am_START_WHEN, "ANY_KEYBOARD")
                                .Set(Am_START_WHERE_TEST, true);
  Am_Object cmd = how_set_inter.Get(Am_COMMAND);
  cmd.Set(Am_DO_METHOD, change_setting);
  window.Add_Part(how_set_inter);

  Am_Object settings_group = Am_Group.Create("settings group")
                                 .Set(Am_TOP, 100)
                                 .Set(Am_LEFT, 10)
                                 .Set(Am_WIDTH, Am_Width_Of_Parts)
                                 .Set(Am_HEIGHT, Am_Height_Of_Parts);

  Am_Object settings = Am_Text.Create("settings").Set(Am_TEXT, "Settings:");
  settings_group.Add_Part(settings);

  int text_spacing = (int)settings.Get(Am_HEIGHT) + 2;
  int line_position = text_spacing + (int)settings.Get(Am_HEIGHT);

  Am_Object fill_setting = Am_Text.Create("fill style setting")
                               .Set(Am_TOP, text_spacing)
                               .Set(Am_TEXT, "Fill Style");
  settings_group.Add_Part(fill_setting)
      .Add_Part(Am_Line.Create().Set(Am_TOP, line_position).Set(Am_WIDTH, 135));

  Am_Object line_setting = Am_Text.Create("line style setting")
                               .Set(Am_TOP, text_spacing)
                               .Set(Am_LEFT, 145)
                               .Set(Am_TEXT, "Line Style");
  settings_group.Add_Part(line_setting)
      .Add_Part(Am_Line.Create()
                    .Set(Am_TOP, line_position)
                    .Set(Am_LEFT, 145)
                    .Set(Am_WIDTH, 135));

  Am_Object mode_setting = Am_Text.Create("mode setting")
                               .Set(Am_TOP, text_spacing)
                               .Set(Am_LEFT, 290)
                               .Set(Am_TEXT, "Drawing Mode");
  settings_group.Add_Part(mode_setting)
      .Add_Part(Am_Line.Create()
                    .Set(Am_TOP, line_position)
                    .Set(Am_LEFT, 290)
                    .Set(Am_WIDTH, 135));

  Am_Object image_setting = Am_Text.Create("image setting")
                                .Set(Am_TOP, text_spacing)
                                .Set(Am_LEFT, 435)
                                .Set(Am_TEXT, "Image Name");
  settings_group.Add_Part(image_setting)
      .Add_Part(Am_Line.Create()
                    .Set(Am_TOP, line_position)
                    .Set(Am_LEFT, 435)
                    .Set(Am_WIDTH, 135));

  text_spacing = (text_spacing * 2) + 3;

  fill_style = Am_Text.Create("fill style")
                   .Set(Am_TOP, text_spacing)
                   .Set(Am_TEXT, "Am_No_Style (default)");
  settings_group.Add_Part(fill_style);

  line_style = Am_Text.Create("line style")
                   .Set(Am_TOP, text_spacing)
                   .Set(Am_LEFT, 145)
                   .Set(Am_TEXT, "Am_Black (default)");
  settings_group.Add_Part(line_style);

  mode = Am_Text.Create("mode")
             .Set(Am_TOP, text_spacing)
             .Set(Am_LEFT, 290)
             .Set(Am_TEXT, "color");
  settings_group.Add_Part(mode);

  image_name = Am_Text.Create("image name")
                   .Set(Am_TOP, text_spacing)
                   .Set(Am_LEFT, 435)
                   .Set(Am_TEXT, "bugsmall.gif");
  settings_group.Add_Part(image_name);

  window.Add_Part(settings_group);
  Am_Screen.Add_Part(window);

  cout << "Type '1' to display ent.xbm" << endl;
  cout << "Type '2' to display ent.gif (transparent)" << endl;
  cout << "Type '3' to display opaque_ent.gif" << endl;
  cout << "Type '4' to display eye10.gif (transparent)" << endl;
  cout << "Type '5' to display opaque_eye10.gif" << endl;
  cout << "Type '6' to display spaceship.gif (transparent)" << endl;
  cout << "Type '7' to display opaque_spaceship.gif" << endl;
  cout << "Type 'b' to set fill style to Am_Black" << endl;
  cout << "Type 'g' to set fill style to Am_Green" << endl;
  cout << "Type 'n' to set fill style to Am_No_Style" << endl;
  cout << "Type 'r' to set fill style to Am_Red" << endl;
  cout << "Type 'w' to set fill style to Am_White" << endl;
  cout << "Type 'B' to set line style to Am_Black" << endl;
  cout << "Type 'G' to set line style to Am_Green" << endl;
  cout << "Type 'N' to set line style to Am_No_Style" << endl;
  cout << "Type 'R' to set line style to Am_Red" << endl;
  cout << "Type 'W' to set line style to Am_White" << endl;
  cout << "Type 'm' to set draw monochrome to true" << endl;
  cout << "Type 'c' to set draw monochrome to false" << endl;
  cout << "Type 'f' to read a nonexistent file" << endl;
  cout << "Type 't' to print the current image in RBG form first row first"
       << endl;
  cout << "Type 'T' to print bugsmall.gif in RBG form first row last" << endl;
  cout << "Type 'z' to print and display spiral bitmap in RBG form first row "
          "first"
       << endl;
  cout << "Type 'Z' to print spiral bitmap in RBG form first row last" << endl;
  cout << "Type 'q' to quit " << endl << flush;

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}